

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSendSession.cpp
# Opt level: O0

void __thiscall FileSendSession::on_error(FileSendSession *this,Poll *p,int event)

{
  bool bVar1;
  path local_40;
  int local_1c;
  Poll *pPStack_18;
  int event_local;
  Poll *p_local;
  FileSendSession *this_local;
  
  local_1c = event;
  pPStack_18 = p;
  p_local = (Poll *)this;
  bVar1 = std::function::operator_cast_to_bool((function *)&this->error);
  if (bVar1) {
    boost::filesystem::path::path(&local_40,&this->file);
    std::function<void_(boost::filesystem::path)>::operator()(&this->error,&local_40);
    boost::filesystem::path::~path(&local_40);
  }
  Subscriber::on_error(&this->super_Subscriber,pPStack_18,local_1c);
  return;
}

Assistant:

void FileSendSession::on_error(Poll &p, int event) {
  if (this->error)
    this->error(file);
  Subscriber::on_error(p, event);
}